

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

Parser * __thiscall cli::Parser::usage_abi_cxx11_(Parser *this)

{
  bool bVar1;
  ostream *poVar2;
  long in_RSI;
  string local_210 [32];
  string local_1f0 [32];
  reference local_1d0;
  CmdBase **command;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_> *__range2;
  stringstream local_1a0 [8];
  stringstream ss;
  ostream local_190 [384];
  Parser *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(local_190,"Available parameters:\n\n");
  __end2 = std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::begin
                     ((vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_> *)
                      (in_RSI + 0x38));
  command = (CmdBase **)
            std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::end
                      ((vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_> *)
                       (in_RSI + 0x38));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
                                *)&command);
    if (!bVar1) break;
    local_1d0 = __gnu_cxx::
                __normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
                ::operator*(&__end2);
    poVar2 = std::operator<<(local_190,"  ");
    poVar2 = std::operator<<(poVar2,(string *)&(*local_1d0)->command);
    poVar2 = std::operator<<(poVar2,"\t");
    std::operator<<(poVar2,(string *)&(*local_1d0)->alternative);
    if (((*local_1d0)->required & 1U) == 1) {
      std::operator<<(local_190,"\t(required)");
    }
    poVar2 = std::operator<<(local_190,"\n   ");
    std::operator<<(poVar2,(string *)&(*local_1d0)->description);
    if (((*local_1d0)->required & 1U) == 0) {
      poVar2 = std::operator<<(local_190,"\n   ");
      (*(*local_1d0)->_vptr_CmdBase[2])(local_210);
      std::operator+((char *)local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     "This parameter is optional. The default value is \'");
      poVar2 = std::operator<<(poVar2,local_1f0);
      std::operator<<(poVar2,"\'.");
      std::__cxx11::string::~string(local_1f0);
      std::__cxx11::string::~string(local_210);
    }
    std::operator<<(local_190,"\n\n");
    __gnu_cxx::
    __normal_iterator<cli::Parser::CmdBase_*const_*,_std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>_>
    ::operator++(&__end2);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string usage() const {
			std::stringstream ss { };
			ss << "Available parameters:\n\n";

			for (const auto& command : _commands) {
				ss << "  " << command->command << "\t" << command->alternative; 

				if (command->required == true) {
					ss << "\t(required)";
				}

				ss << "\n   " << command->description;

				if (command->required == false) {
					ss << "\n   " << "This parameter is optional. The default value is '" + command->print_value() << "'.";
				}

				ss << "\n\n";
			}

			return ss.str();
		}